

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.h
# Opt level: O0

void __thiscall
vkb::Result<vkb::detail::SurfaceSupportDetails>::destroy
          (Result<vkb::detail::SurfaceSupportDetails> *this)

{
  Result<vkb::detail::SurfaceSupportDetails> *this_local;
  
  if ((this->m_init & 1U) != 0) {
    detail::SurfaceSupportDetails::~SurfaceSupportDetails((SurfaceSupportDetails *)this);
  }
  return;
}

Assistant:

void destroy() {
        if (m_init) m_value.~T();
    }